

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.cpp
# Opt level: O0

int arbiter::remove(char *__filename)

{
  int iVar1;
  char *__filename_00;
  string local_50;
  string local_30;
  char *local_10;
  string *filename_local;
  
  local_10 = __filename;
  ::std::__cxx11::string::string((string *)&local_50,(string *)__filename);
  expandTilde(&local_30,&local_50);
  ::std::__cxx11::string::operator=((string *)__filename,(string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_50);
  __filename_00 = (char *)::std::__cxx11::string::c_str();
  iVar1 = ::remove(__filename_00);
  return CONCAT31((int3)((uint)iVar1 >> 8),iVar1 == 0);
}

Assistant:

bool remove(std::string filename)
{
    filename = expandTilde(filename);

    return ::remove(filename.c_str()) == 0;
}